

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FCPY(DisasContext_conflict1 *s,arg_FCPY *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint64_t val;
  TCGv_i64 val_00;
  TCGv_i64 t_imm;
  uint64_t imm;
  TCGContext_conflict1 *tcg_ctx;
  arg_FCPY *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      val = vfp_expand_imm_aarch64(a->esz,(uint8_t)a->imm);
      val_00 = tcg_const_i64_aarch64(tcg_ctx_00,val);
      do_cpy_m(s,a->esz,a->rd,a->rn,a->pg,val_00);
      tcg_temp_free_i64(tcg_ctx_00,val_00);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_FCPY(DisasContext *s, arg_FCPY *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        /* Decode the VFP immediate.  */
        uint64_t imm = vfp_expand_imm(a->esz, a->imm);
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, imm);
        do_cpy_m(s, a->esz, a->rd, a->rn, a->pg, t_imm);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}